

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

int __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::shutdown(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,int __fd,int __how)

{
  int iVar1;
  
  std::mutex::lock(&this->m_lock);
  this->m_shutdown_started = true;
  __std__for_each<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::thread_with_refcounter_t>>,void(*)(std::pair<std::__cxx11::string_const,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::thread_with_refcounter_t>&)>_std___Rb_tree_iterator<std::pair<std::__cxx11::string_const,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::thread_with_refcounter_t>>_std___Rb_tree_iterator<std::pair<std::__cxx11::string_const,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::thread_with_refcounter_t>>_void____std__pair<std::__cxx11::string_const,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::thread_with_refcounter_t>____
            ((this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>::thread_with_refcounter_t>_>
              )&(this->m_groups)._M_t._M_impl.super__Rb_tree_header,
             (anonymous_namespace)::
             call_shutdown<std::pair<std::__cxx11::string_const,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>::thread_with_refcounter_t>>
            );
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar1;
}

Assistant:

virtual void
		shutdown() override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				// Starting shutdown process.
				// New groups will not be created. But old groups remain.
				m_shutdown_started = true;

				std::for_each(
					m_groups.begin(),
					m_groups.end(),
					call_shutdown< typename active_group_map_t::value_type > );
			}